

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_base.cpp
# Opt level: O0

int __thiscall
zmq::socket_base_t::setsockopt
          (socket_base_t *this,int __fd,int __level,int __optname,void *__optval,socklen_t __optlen)

{
  int *piVar1;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  int rc;
  scoped_optional_lock_t sync_lock;
  mutex_t *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  int option_;
  int local_4;
  
  if ((this->_thread_safe & 1U) == 0) {
    option_ = 0;
  }
  else {
    option_ = (int)((ulong)&this->_sync >> 0x20);
  }
  scoped_optional_lock_t::scoped_optional_lock_t
            ((scoped_optional_lock_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
             ,in_stack_ffffffffffffff98);
  if ((this->_ctx_terminated & 1U) == 0) {
    local_4 = (*(this->super_own_t).super_object_t._vptr_object_t[0x21])
                        (this,(ulong)(uint)__fd,CONCAT44(in_register_00000014,__level),
                         CONCAT44(in_register_0000000c,__optname));
    in_stack_ffffffffffffffa4 = local_4;
    if ((local_4 != 0) && (piVar1 = __errno_location(), *piVar1 == 0x16)) {
      local_4 = options_t::setsockopt
                          (&(this->super_own_t).options,__fd,__level,__optname,__optval,__optlen);
      in_stack_ffffffffffffffa0 = local_4;
      update_pipe_options(this,option_);
    }
  }
  else {
    piVar1 = __errno_location();
    *piVar1 = 0x9523dfd;
    local_4 = -1;
  }
  scoped_optional_lock_t::~scoped_optional_lock_t
            ((scoped_optional_lock_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
            );
  return local_4;
}

Assistant:

int zmq::socket_base_t::setsockopt (int option_,
                                    const void *optval_,
                                    size_t optvallen_)
{
    scoped_optional_lock_t sync_lock (_thread_safe ? &_sync : NULL);

    if (unlikely (_ctx_terminated)) {
        errno = ETERM;
        return -1;
    }

    //  First, check whether specific socket type overloads the option.
    int rc = xsetsockopt (option_, optval_, optvallen_);
    if (rc == 0 || errno != EINVAL) {
        return rc;
    }

    //  If the socket type doesn't support the option, pass it to
    //  the generic option parser.
    rc = options.setsockopt (option_, optval_, optvallen_);
    update_pipe_options (option_);

    return rc;
}